

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

bool __thiscall ON_SubDComponentRef::IsValid(ON_SubDComponentRef *this,ON_TextLog *text_log)

{
  bool bVar1;
  ON_SubD *this_00;
  
  bVar1 = ON_SubDComponentPtr::IsNotNull(&this->m_component_ptr);
  if ((bVar1) && ((byte)(this->m_component_location - ControlNet) < 2)) {
    this_00 = (this->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_00 == (element_type *)0x0) {
      this_00 = &ON_SubD::Empty;
    }
    bVar1 = ON_SubD::IsEmpty(this_00);
    bVar1 = !bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_SubDComponentRef::IsValid(ON_TextLog* text_log) const
{
  return (
    m_component_ptr.IsNotNull() 
    && (ON_SubDComponentLocation::ControlNet == m_component_location || ON_SubDComponentLocation::Surface == m_component_location)
    && false == SubD().IsEmpty()
    );
}